

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

void __thiscall
helics::Interface::Interface
          (Interface *this,Federate *federate,InterfaceHandle hid,string_view actName)

{
  bool bVar1;
  __shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  undefined4 in_EDX;
  Federate *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  shared_ptr<helics::Core> *crp;
  allocator<char> *in_stack_ffffffffffffffd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&PTR__Interface_009c1670;
  in_RDI->_M_string_length = 0;
  *(undefined4 *)&in_RDI->field_2 = in_EDX;
  this_01 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (this_01,(basic_string_view<char,_std::char_traits<char>_> *)in_RSI,
             in_stack_ffffffffffffffd0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd7);
  if (in_RSI != (Federate *)0x0) {
    this_00 = (__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> *)
              Federate::getCorePointer(in_RSI);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this_00);
    if (bVar1) {
      peVar2 = std::__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>::get(this_00);
      in_RDI->_M_string_length = (size_type)peVar2;
    }
  }
  return;
}

Assistant:

Interface::Interface(Federate* federate, InterfaceHandle hid, std::string_view actName):
    handle(hid), mName(actName)
{
    if (federate != nullptr) {
        const auto& crp = federate->getCorePointer();
        if (crp) {
            mCore = crp.get();
        }
    }
}